

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall Memory::Recycler::BackgroundFinishMark(Recycler *this)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  CollectionState CVar4;
  undefined4 *puVar5;
  size_t sVar6;
  size_t sVar7;
  CollectionState local_38;
  CollectionState local_34;
  
  if (this->inPartialCollectMode == false) {
    bVar3 = DoQueueTrackedObject(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x162d,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                         "this->inPartialCollectMode || this->DoQueueTrackedObject()");
      if (!bVar3) goto LAB_00714b0d;
      *puVar5 = 0;
    }
  }
  if ((this->collectionState).value != CollectionStateConcurrentFinishMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1631,"(collectionState == CollectionStateConcurrentFinishMark)",
                       "collectionState == CollectionStateConcurrentFinishMark");
    if (!bVar3) {
LAB_00714b0d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  sVar6 = FinishMarkRescan(this,true);
  local_34 = CollectionStateConcurrentFindRoots;
  pOVar1 = (this->collectionState).observer;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateConcurrentFindRoots)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_34,&this->collectionState);
  }
  (this->collectionState).value = local_34;
  sVar7 = BackgroundFindRoots(this);
  _local_38 = CONCAT44(local_34,0xe001);
  pOVar1 = (this->collectionState).observer;
  CVar4 = CollectionStateConcurrentFinishMark;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateConcurrentFinishMark)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_38,&this->collectionState);
    CVar4 = local_38;
  }
  (this->collectionState).value = CVar4;
  ProcessMark(this,false);
  return sVar7 + sVar6 * 0x1000;
}

Assistant:

size_t
Recycler::BackgroundFinishMark()
{
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif
    Assert(collectionState == CollectionStateConcurrentFinishMark);
    size_t rescannedRootBytes = FinishMarkRescan(true) * AutoSystemInfo::PageSize;
    this->SetCollectionState(CollectionStateConcurrentFindRoots);
    rescannedRootBytes += this->BackgroundFindRoots();
    this->SetCollectionState(CollectionStateConcurrentFinishMark);
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::MarkPhase);
    ProcessMark(true);
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::MarkPhase);
    return rescannedRootBytes;
}